

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O1

void __thiscall
asio::detail::reactive_socket_service<asio::ip::tcp>::
async_accept<asio::basic_socket<asio::ip::tcp>,asio::detail::wrapped_handler<asio::io_context::strand,std::_Bind<void(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::*(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>*,std::function<void(std::error_code_const&)>,std::_Placeholder<1>))(std::function<void(std::error_code_const&)>,std::error_code_const&)>,asio::detail::is_continuation_if_running>>
          (reactive_socket_service<asio::ip::tcp> *this,implementation_type *impl,
          basic_socket<asio::ip::tcp> *peer,endpoint_type *peer_endpoint,
          wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::*(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>_*,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>
          *handler)

{
  long *plVar1;
  reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp>,_asio::ip::tcp,_asio::detail::wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::*(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>_*,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>_>
  *this_00;
  undefined8 uVar2;
  template_rebind_alloc<reactive_socket_accept_op<basic_socket<tcp>,_tcp,_wrapped_handler<strand,__Bind<void_(endpoint<transport_config>::*(endpoint<transport_config>_*,_function<void_(const_error_code_&)>,__Placeholder<1>))(function<void_(const_error_code_&)>,_const_error_code_&)>,_is_continuation_if_running>_>_>
  a;
  long in_FS_OFFSET;
  bool is_continuation;
  ptr local_48;
  
  plVar1 = *(long **)(in_FS_OFFSET + -8);
  if (plVar1 != (long *)0x0) {
    do {
      if ((implementation_type)*plVar1 == (handler->dispatcher_).impl_) {
        is_continuation = plVar1[1] != 0;
        goto LAB_00199ee7;
      }
      plVar1 = (long *)plVar1[2];
    } while (plVar1 != (long *)0x0);
  }
  is_continuation = false;
LAB_00199ee7:
  if (*(long *)(in_FS_OFFSET + -0x10) == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = *(undefined8 *)(*(long *)(in_FS_OFFSET + -0x10) + 8);
  }
  local_48.h = handler;
  this_00 = (reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp>,_asio::ip::tcp,_asio::detail::wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::*(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>_*,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>_>
             *)thread_info_base::allocate<asio::detail::thread_info_base::default_tag>(uVar2,0xb0);
  local_48.p = (reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp>,_asio::ip::tcp,_asio::detail::wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::*(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>_*,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>_>
                *)0x0;
  local_48.v = this_00;
  reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp>,_asio::ip::tcp,_asio::detail::wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::*(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>_*,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>_>
  ::reactive_socket_accept_op
            (this_00,(impl->super_base_implementation_type).socket_,
             (impl->super_base_implementation_type).state_,peer,&impl->protocol_,peer_endpoint,
             handler);
  local_48.p = this_00;
  if ((peer->super_basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>).
      implementation_.super_base_implementation_type.socket_ == -1) {
    reactive_socket_service_base::start_op
              (&this->super_reactive_socket_service_base,&impl->super_base_implementation_type,0,
               (reactor_op *)this_00,is_continuation,true,false);
  }
  else {
    std::error_code::operator=
              (&(this_00->
                super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp>,_asio::ip::tcp>
                ).super_reactor_op.ec_,already_open);
    scheduler::post_immediate_completion
              (((this->super_reactive_socket_service_base).reactor_)->scheduler_,
               (operation *)this_00,is_continuation);
  }
  local_48.v = (reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp>,_asio::ip::tcp,_asio::detail::wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::*(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>_*,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>_>
                *)0x0;
  local_48.p = (reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp>,_asio::ip::tcp,_asio::detail::wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::*(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>_*,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>_>
                *)0x0;
  reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp>,_asio::ip::tcp,_asio::detail::wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::*(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>_*,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>_>
  ::ptr::reset(&local_48);
  return;
}

Assistant:

void async_accept(implementation_type& impl, Socket& peer,
      endpoint_type* peer_endpoint, Handler& handler)
  {
    bool is_continuation =
      asio_handler_cont_helpers::is_continuation(handler);

    // Allocate and construct an operation to wrap the handler.
    typedef reactive_socket_accept_op<Socket, Protocol, Handler> op;
    typename op::ptr p = { asio::detail::addressof(handler),
      op::ptr::allocate(handler), 0 };
    p.p = new (p.v) op(impl.socket_, impl.state_, peer,
        impl.protocol_, peer_endpoint, handler);

    ASIO_HANDLER_CREATION((reactor_.context(), *p.p, "socket",
          &impl, impl.socket_, "async_accept"));

    start_accept_op(impl, p.p, is_continuation, peer.is_open());
    p.v = p.p = 0;
  }